

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O0

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::ReadTypedArray
          (DeserializationCloner<Js::StreamReader> *this,SrcTypeId typeId,Dst *dst)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Dst *dst_local;
  SrcTypeId typeId_local;
  DeserializationCloner<Js::StreamReader> *this_local;
  
  switch(typeId) {
  case SCA_Int8Array:
    ReadTypedArray<char,false>(this,dst);
    break;
  case SCA_Uint8Array:
    ReadTypedArray<unsigned_char,false>(this,dst);
    break;
  case SCA_Int16Array:
    ReadTypedArray<short,false>(this,dst);
    break;
  case SCA_Uint16Array:
    ReadTypedArray<unsigned_short,false>(this,dst);
    break;
  case SCA_Int32Array:
    ReadTypedArray<int,false>(this,dst);
    break;
  case SCA_Uint32Array:
    ReadTypedArray<unsigned_int,false>(this,dst);
    break;
  case SCA_Float32Array:
    ReadTypedArray<float,false>(this,dst);
    break;
  case SCA_Float64Array:
    ReadTypedArray<double,false>(this,dst);
    break;
  case SCA_DataView:
    ReadTypedArray<Js::DataView,false>(this,dst);
    break;
  case SCA_Uint8ClampedArray:
    ReadTypedArray<unsigned_char,true>(this,dst);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                                ,0x236,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void DeserializationCloner<Reader>::ReadTypedArray(SrcTypeId typeId, Dst* dst) const
    {
        switch (typeId)
        {
        case SCA_Int8Array:
            ReadTypedArray<int8, false>(dst);
            break;

        case SCA_Uint8Array:
            ReadTypedArray<uint8, false>(dst);
            break;

        case SCA_Uint8ClampedArray:
            ReadTypedArray<uint8, true>(dst);
            break;

        case SCA_Int16Array:
            ReadTypedArray<int16, false>(dst);
            break;

        case SCA_Uint16Array:
            ReadTypedArray<uint16, false>(dst);
            break;

        case SCA_Int32Array:
            ReadTypedArray<int32, false>(dst);
            break;

        case SCA_Uint32Array:
            ReadTypedArray<uint32, false>(dst);
            break;

        case SCA_Float32Array:
            ReadTypedArray<float, false>(dst);
            break;

        case SCA_Float64Array:
            ReadTypedArray<double, false>(dst);
            break;

        case SCA_DataView:
            ReadTypedArray<DataView, false>(dst);
            break;

        default:
            Assert(false);
            break;
        }
    }